

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

void http_connect(curl_socket_t *infdp,curl_socket_t rootfd,char *ipaddr,unsigned_short ipport)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  undefined4 in_register_00000034;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  size_t sVar16;
  bool bVar17;
  _Bool poll_server_wr [2];
  _Bool poll_client_wr [2];
  _Bool poll_server_rd [2];
  _Bool poll_client_rd [2];
  curl_socket_t serverfd [2];
  curl_socket_t clientfd [2];
  ssize_t tos [2];
  ssize_t toc [2];
  curl_socklen_t flag;
  fd_set input;
  timeval timeout;
  fd_set output;
  char readserver [2] [256];
  char readclient [2] [256];
  httprequest req2;
  char acStack_2503c [8];
  uint uStack_25034;
  char *pcStack_25030;
  uint uStack_25024;
  uint auStack_25020 [4];
  char *pcStack_25010;
  ulong uStack_25008;
  ulong uStack_25000;
  size_t asStack_24ff8 [4];
  ulong uStack_24fd8;
  ulong uStack_24fd0;
  undefined4 uStack_24fc4;
  long lStack_24fc0;
  ulong uStack_24fb8;
  char *pcStack_24fb0;
  curl_socket_t *pcStack_24fa8;
  char *pcStack_24fa0;
  fd_set fStack_24f98;
  timeval tStack_24f18;
  fd_set fStack_24f08;
  char acStack_24e88 [512];
  char acStack_24c88 [520];
  httprequest hStack_24a80;
  
  pcStack_24fb0 = ipaddr;
  uStack_24fd8 = CONCAT44(in_register_00000034,rootfd);
  auStack_25020[0] = 0xffffffff;
  auStack_25020[1] = 0xffffffff;
  asStack_24ff8[2] = 0;
  asStack_24ff8[3] = 0;
  asStack_24ff8[0] = 0;
  asStack_24ff8[1] = 0;
  builtin_strncpy(acStack_2503c + 4,"\x01\x01\x01\x01",4);
  builtin_strncpy(acStack_2503c,"\x01\x01\x01\x01",4);
  pcStack_24fa8 = infdp;
  auStack_25020[3] = 0xffffffff;
  auStack_25020[2] = *infdp;
  uVar10 = 3;
  do {
    if (got_exit_signal != 0) break;
    wait_ms(0xfa);
    uVar10 = uVar10 - 1;
  } while (1 < uVar10);
  if (got_exit_signal == 0) {
    auStack_25020[0] = connect_to(pcStack_24fb0,ipport);
    if (auStack_25020[0] != 0xffffffff) {
      iVar3 = (int)uStack_24fd8;
      iVar4 = iVar3 + 0x3f;
      if (-1 < iVar3) {
        iVar4 = iVar3;
      }
      uStack_24fb8 = 1L << ((byte)uStack_24fd8 & 0x3f);
      lStack_24fc0 = (long)(iVar4 >> 6);
      uStack_25024 = (uint)CONCAT71((int7)(int3)(iVar4 >> 0xe),1);
      uStack_25000 = 0;
      uVar10 = 0;
      uStack_25034 = 0;
      do {
        if (got_exit_signal != 0) break;
        tStack_24f18.tv_sec = 1;
        tStack_24f18.tv_usec = 0;
        fStack_24f98.fds_bits[0] = 0;
        fStack_24f98.fds_bits[1] = 0;
        fStack_24f98.fds_bits[2] = 0;
        fStack_24f98.fds_bits[3] = 0;
        fStack_24f98.fds_bits[4] = 0;
        fStack_24f98.fds_bits[5] = 0;
        fStack_24f98.fds_bits[6] = 0;
        fStack_24f98.fds_bits[7] = 0;
        fStack_24f98.fds_bits[8] = 0;
        fStack_24f98.fds_bits[9] = 0;
        fStack_24f98.fds_bits[10] = 0;
        fStack_24f98.fds_bits[0xb] = 0;
        fStack_24f98.fds_bits[0xc] = 0;
        fStack_24f98.fds_bits[0xd] = 0;
        fStack_24f98.fds_bits[0xe] = 0;
        fStack_24f98.fds_bits[0xf] = 0;
        fStack_24f08.fds_bits[0] = 0;
        fStack_24f08.fds_bits[1] = 0;
        fStack_24f08.fds_bits[2] = 0;
        fStack_24f08.fds_bits[3] = 0;
        fStack_24f08.fds_bits[4] = 0;
        fStack_24f08.fds_bits[5] = 0;
        fStack_24f08.fds_bits[6] = 0;
        fStack_24f08.fds_bits[7] = 0;
        fStack_24f08.fds_bits[8] = 0;
        fStack_24f08.fds_bits[9] = 0;
        fStack_24f08.fds_bits[10] = 0;
        fStack_24f08.fds_bits[0xb] = 0;
        fStack_24f08.fds_bits[0xc] = 0;
        fStack_24f08.fds_bits[0xd] = 0;
        fStack_24f08.fds_bits[0xe] = 0;
        fStack_24f08.fds_bits[0xf] = 0;
        uVar12 = 0xffffffff;
        bVar17 = (auStack_25020[1] & auStack_25020[3]) == 0xffffffff;
        if ((((bVar17) && (acStack_2503c[6] == '\x01')) && (acStack_2503c[2] == '\x01')) &&
           ((acStack_2503c[4] == '\x01' && (acStack_2503c[0] == '\x01')))) {
          fStack_24f98.fds_bits[lStack_24fc0] = fStack_24f98.fds_bits[lStack_24fc0] | uStack_24fb8;
          uVar12 = uStack_24fd8 & 0xffffffff;
        }
        uVar9 = 0;
        do {
          uVar11 = auStack_25020[uVar9 + 2];
          if (uVar11 != 0xffffffff) {
            if (acStack_2503c[uVar9 + 6] == '\x01') {
              uVar14 = uVar11 + 0x3f;
              if (-1 < (int)uVar11) {
                uVar14 = uVar11;
              }
              fStack_24f98.fds_bits[(int)uVar14 >> 6] =
                   fStack_24f98.fds_bits[(int)uVar14 >> 6] | 1L << ((byte)uVar11 & 0x3f);
              if ((int)uVar12 < (int)uVar11) {
                uVar12 = (ulong)uVar11;
              }
            }
            if ((acStack_2503c[uVar9 + 2] == '\x01') && (asStack_24ff8[uVar9 + 2] != 0)) {
              uVar14 = uVar11 + 0x3f;
              if (-1 < (int)uVar11) {
                uVar14 = uVar11;
              }
              fStack_24f08.fds_bits[(int)uVar14 >> 6] =
                   fStack_24f08.fds_bits[(int)uVar14 >> 6] | 1L << ((byte)uVar11 & 0x3f);
              if ((int)uVar11 <= (int)(uint)uVar12) {
                uVar11 = (uint)uVar12;
              }
              uVar12 = (ulong)uVar11;
            }
          }
          uVar11 = auStack_25020[uVar9];
          if (uVar11 != 0xffffffff) {
            uVar2 = uVar12;
            if (acStack_2503c[uVar9 + 4] == '\x01') {
              uVar14 = uVar11 + 0x3f;
              if (-1 < (int)uVar11) {
                uVar14 = uVar11;
              }
              fStack_24f98.fds_bits[(int)uVar14 >> 6] =
                   fStack_24f98.fds_bits[(int)uVar14 >> 6] | 1L << ((byte)uVar11 & 0x3f);
              uVar2 = (ulong)uVar11;
              if ((int)uVar11 <= (int)uVar12) {
                uVar2 = uVar12;
              }
            }
            uVar12 = uVar2;
            if ((acStack_2503c[uVar9] == '\x01') && (asStack_24ff8[uVar9] != 0)) {
              uVar14 = uVar11 + 0x3f;
              if (-1 < (int)uVar11) {
                uVar14 = uVar11;
              }
              fStack_24f08.fds_bits[(int)uVar14 >> 6] =
                   fStack_24f08.fds_bits[(int)uVar14 >> 6] | 1L << ((byte)uVar11 & 0x3f);
              if ((int)uVar11 <= (int)(uint)uVar12) {
                uVar11 = (uint)uVar12;
              }
              uVar12 = (ulong)uVar11;
            }
          }
          uVar9 = uVar9 + 1;
        } while ((int)uStack_25000 + 1 != uVar9);
        do {
          iVar3 = select((int)uVar12 + 1,&fStack_24f98,&fStack_24f08,(fd_set *)0x0,&tStack_24f18);
          if ((-1 < iVar3) || (piVar5 = __errno_location(), *piVar5 != 4)) break;
        } while (got_exit_signal == 0);
        if (got_exit_signal == 0) {
          if (iVar3 < 1) {
            if ((int)uVar10 >= 5) {
              logmsg("CONNECT proxy timeout after %d idle seconds!",(ulong)(uVar10 + 1));
            }
            uVar11 = (uint)((int)uVar10 < 5);
            uVar10 = uVar10 + 1;
          }
          else {
            if ((bVar17) && ((fStack_24f98.fds_bits[lStack_24fc0] & uStack_24fb8) != 0)) {
              iVar3 = accept((int)uStack_24fd8,(sockaddr *)0x0,(socklen_t *)0x0);
              if (iVar3 != -1) {
                memset(&hStack_24a80,0,0x24a50);
                logmsg("====> Client connect DATA");
                if ((socket_domain + DOCNUMBER_WERULEZ & 0xfffffff7U) == 0) {
                  uStack_24fc4 = 1;
                  iVar4 = setsockopt(iVar3,6,1,&uStack_24fc4,4);
                  if (iVar4 != 0) {
                    logmsg("====> TCP_NODELAY for client DATA connection failed");
                  }
                }
                do {
                  iVar4 = get_request(iVar3,&hStack_24a80);
                } while (-1 < iVar4);
                if (-1 < iVar4) {
                  send_doc(iVar3,&hStack_24a80);
                }
                if (iVar3 != -1) {
                  shutdown(iVar3,2);
                  close(iVar3);
                }
              }
              uVar10 = 0;
              uVar11 = (uint)(got_exit_signal == 0);
              if (got_exit_signal != 0) goto LAB_001080c5;
            }
            uStack_24fd0 = (ulong)((int)uStack_25000 + 1);
            uVar12 = 0;
            pcVar13 = acStack_24e88;
            pcVar7 = acStack_24c88;
            uStack_25008 = 0;
            do {
              uVar10 = auStack_25020[uVar12 + 2];
              if (uVar10 != 0xffffffff) {
                sVar16 = asStack_24ff8[uVar12];
                if (sVar16 - 0x100 != 0) {
                  uVar11 = uVar10 + 0x3f;
                  if (-1 < (int)uVar10) {
                    uVar11 = uVar10;
                  }
                  if (((ulong)fStack_24f98.fds_bits[(int)uVar11 >> 6] >> ((ulong)uVar10 & 0x3f) & 1)
                      != 0) {
                    pcStack_25030 = pcVar13;
                    pcStack_25010 = pcVar7;
                    sVar6 = recv(uVar10,pcVar7 + sVar16,-(sVar16 - 0x100),0);
                    pcVar13 = "DATA";
                    if (uVar12 == 0) {
                      pcVar13 = "CTRL";
                    }
                    if ((long)sVar6 < 1) {
                      logmsg("[%s] got %zd, STOP READING client",pcVar13,sVar6);
                      shutdown(uVar10,0);
                      acStack_2503c[uVar12 + 6] = '\0';
                      pcVar13 = pcStack_25030;
                      pcVar7 = pcStack_25010;
                    }
                    else {
                      logmsg("[%s] READ %zd bytes from client",pcVar13,sVar6);
                      pcVar7 = data_to_hex(pcVar7 + sVar16,sVar6);
                      logmsg("[%s] READ \"%s\"",pcVar13,pcVar7);
                      asStack_24ff8[uVar12] = sVar6 + sVar16;
                      pcVar13 = pcStack_25030;
                      pcVar7 = pcStack_25010;
                    }
                  }
                }
              }
              uVar11 = auStack_25020[uVar12];
              if (uVar11 != 0xffffffff) {
                sVar16 = asStack_24ff8[uVar12 + 2];
                if (sVar16 - 0x100 != 0) {
                  uVar14 = uVar11 + 0x3f;
                  if (-1 < (int)uVar11) {
                    uVar14 = uVar11;
                  }
                  if (((ulong)fStack_24f98.fds_bits[(int)uVar14 >> 6] >> ((ulong)uVar11 & 0x3f) & 1)
                      != 0) {
                    pcStack_24fa0 = pcVar13 + sVar16;
                    pcStack_25030 = pcVar13;
                    pcStack_25010 = pcVar7;
                    sVar6 = recv(uVar11,pcStack_24fa0,-(sVar16 - 0x100),0);
                    pcVar13 = "DATA";
                    if (uVar12 == 0) {
                      pcVar13 = "CTRL";
                    }
                    if ((long)sVar6 < 1) {
                      logmsg("[%s] got %zd, STOP READING server",pcVar13,sVar6);
                      shutdown(uVar11,0);
                      acStack_2503c[uVar12 + 4] = '\0';
                      pcVar13 = pcStack_25030;
                      pcVar7 = pcStack_25010;
                    }
                    else {
                      logmsg("[%s] READ %zd bytes from server",pcVar13,sVar6);
                      pcVar7 = data_to_hex(pcStack_24fa0,sVar6);
                      logmsg("[%s] READ \"%s\"",pcVar13,pcVar7);
                      asStack_24ff8[uVar12 + 2] = sVar6 + sVar16;
                      pcVar13 = pcStack_25030;
                      pcVar7 = pcStack_25010;
                    }
                  }
                }
              }
              if ((uVar10 != 0xffffffff) && (sVar16 = asStack_24ff8[uVar12 + 2], sVar16 != 0)) {
                uVar14 = uVar10 + 0x3f;
                if (-1 < (int)uVar10) {
                  uVar14 = uVar10;
                }
                if (((ulong)fStack_24f08.fds_bits[(int)uVar14 >> 6] >> ((ulong)uVar10 & 0x3f) & 1)
                    != 0) {
                  pcStack_25030 = pcVar13;
                  pcStack_25010 = pcVar7;
                  sVar6 = send(uVar10,pcVar13,sVar16,0x4000);
                  pcVar7 = "DATA";
                  if (uVar12 == 0) {
                    pcVar7 = "CTRL";
                  }
                  if ((long)sVar6 < 1) {
                    logmsg("[%s] got %zd, STOP WRITING client",pcVar7,sVar6);
                    iVar3 = shutdown(uVar10,1);
                    acStack_2503c[uVar12 + 2] = '\0';
                    uStack_25008 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
                    pcVar13 = pcStack_25030;
                    pcVar7 = pcStack_25010;
                  }
                  else {
                    logmsg("[%s] SENT %zd bytes to client",pcVar7,sVar6);
                    pcVar13 = pcStack_25030;
                    pcVar8 = data_to_hex(pcStack_25030,sVar6);
                    logmsg("[%s] SENT \"%s\"",pcVar7,pcVar8);
                    sVar16 = sVar16 - sVar6;
                    if (sVar16 != 0) {
                      memmove(pcVar13,pcVar13 + sVar6,sVar16);
                    }
                    asStack_24ff8[uVar12 + 2] = sVar16;
                    pcVar7 = pcStack_25010;
                  }
                }
              }
              if ((uVar11 != 0xffffffff) && (sVar16 = asStack_24ff8[uVar12], sVar16 != 0)) {
                uVar10 = uVar11 + 0x3f;
                if (-1 < (int)uVar11) {
                  uVar10 = uVar11;
                }
                if (((ulong)fStack_24f08.fds_bits[(int)uVar10 >> 6] >> ((ulong)uVar11 & 0x3f) & 1)
                    != 0) {
                  pcStack_25030 = pcVar13;
                  sVar6 = send(uVar11,pcVar7,sVar16,0x4000);
                  pcVar13 = "DATA";
                  if (uVar12 == 0) {
                    pcVar13 = "CTRL";
                  }
                  if ((long)sVar6 < 1) {
                    logmsg("[%s] got %zd, STOP WRITING server",pcVar13,sVar6);
                    iVar3 = shutdown(uVar11,1);
                    acStack_2503c[uVar12] = '\0';
                    uStack_25008 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar3) >> 8),1);
                    pcVar13 = pcStack_25030;
                  }
                  else {
                    logmsg("[%s] SENT %zd bytes to server",pcVar13,sVar6);
                    pcVar8 = data_to_hex(pcVar7,sVar6);
                    logmsg("[%s] SENT \"%s\"",pcVar13,pcVar8);
                    sVar16 = sVar16 - sVar6;
                    if (sVar16 != 0) {
                      memmove(pcVar7,pcVar7 + sVar6,sVar16);
                    }
                    asStack_24ff8[uVar12] = sVar16;
                    pcVar13 = pcStack_25030;
                  }
                }
              }
              uVar12 = uVar12 + 1;
              pcVar7 = pcVar7 + 0x100;
              pcVar13 = pcVar13 + 0x100;
            } while (uStack_24fd0 != uVar12);
            uVar10 = 0;
            if (got_exit_signal != 0) goto LAB_001080c3;
            uVar12 = 0;
            do {
              uVar11 = auStack_25020[uVar12 + 2];
              pcVar13 = "DATA";
              if (uVar12 == 0) {
                pcVar13 = "CTRL";
              }
              uVar14 = 3;
              do {
                if (uVar11 != 0xffffffff) {
                  if ((acStack_2503c[uVar12 + 6] == '\x01') && (acStack_2503c[uVar12] == '\0')) {
                    logmsg("[%s] DISABLED READING client");
                    shutdown(uVar11,0);
                    acStack_2503c[uVar12 + 6] = '\0';
                  }
                  if (((acStack_2503c[uVar12 + 2] == '\x01') && (acStack_2503c[uVar12 + 4] == '\0'))
                     && (asStack_24ff8[uVar12 + 2] == 0)) {
                    logmsg("[%s] DISABLED WRITING client",pcVar13);
                    iVar3 = shutdown(uVar11,1);
                    acStack_2503c[uVar12 + 2] = '\0';
                    uStack_25008 = CONCAT71((int7)(CONCAT44(extraout_var_01,iVar3) >> 8),1);
                  }
                }
                uVar1 = auStack_25020[uVar12];
                if (uVar1 != 0xffffffff) {
                  if ((acStack_2503c[uVar12 + 4] == '\x01') && (acStack_2503c[uVar12 + 2] == '\0'))
                  {
                    logmsg("[%s] DISABLED READING server");
                    shutdown(uVar1,0);
                    acStack_2503c[uVar12 + 4] = '\0';
                  }
                  if (((acStack_2503c[uVar12] == '\x01') && (acStack_2503c[uVar12 + 6] == '\0')) &&
                     (asStack_24ff8[uVar12] == 0)) {
                    logmsg("[%s] DISABLED WRITING server",pcVar13);
                    iVar3 = shutdown(uVar1,1);
                    acStack_2503c[uVar12] = '\0';
                    uStack_25008 = CONCAT71((int7)(CONCAT44(extraout_var_02,iVar3) >> 8),1);
                  }
                }
                uVar14 = uVar14 - 1;
              } while (1 < uVar14);
              uVar12 = uVar12 + 1;
            } while (uVar12 != uStack_24fd0);
            if ((uStack_25008 & 1) != 0) {
              wait_ms(0xfa);
            }
            uVar12 = 0;
            do {
              uVar11 = auStack_25020[uVar12 + 2];
              pcVar13 = "DATA";
              if (uVar12 == 0) {
                pcVar13 = "CTRL";
              }
              uVar14 = 3;
              do {
                if (((uVar11 != 0xffffffff) && (acStack_2503c[uVar12 + 2] == '\0')) &&
                   (acStack_2503c[uVar12 + 6] == '\0')) {
                  logmsg("[%s] CLOSING client socket",pcVar13);
                  close(uVar11);
                  uVar11 = 0xffffffff;
                  if (auStack_25020[uVar12] == 0xffffffff) {
                    logmsg("[%s] ENDING",pcVar13);
                    uStack_25034 = uStack_25034 & 0xff;
                    if (uVar12 == 1) {
                      uStack_25034 = 0;
                    }
                    uStack_25024 = uStack_25024 & 0xff;
                    if (uVar12 != 1) {
                      uStack_25024 = 0;
                    }
                  }
                }
                uVar1 = auStack_25020[uVar12];
                if (((uVar1 != 0xffffffff) && (acStack_2503c[uVar12] == '\0')) &&
                   (acStack_2503c[uVar12 + 4] == '\0')) {
                  logmsg("[%s] CLOSING server socket",pcVar13);
                  close(uVar1);
                  auStack_25020[uVar12] = 0xffffffff;
                  if (uVar11 == 0xffffffff) {
                    logmsg("[%s] ENDING",pcVar13);
                    uStack_25034 = uStack_25034 & 0xff;
                    if (uVar12 == 1) {
                      uStack_25034 = 0;
                    }
                    uStack_25024 = uStack_25024 & 0xff;
                    if (uVar12 != 1) {
                      uStack_25024 = 0;
                    }
                  }
                }
                uVar14 = uVar14 - 1;
              } while (1 < uVar14);
              auStack_25020[uVar12 + 2] = uVar11;
              uVar12 = uVar12 + 1;
            } while (uVar12 != uStack_24fd0);
            uStack_25000 = (ulong)((byte)uStack_25034 & 1);
            uVar11 = uStack_25024;
          }
        }
        else {
LAB_001080c3:
          uVar11 = 0;
        }
LAB_001080c5:
      } while ((uVar11 & 1) != 0);
    }
  }
  lVar15 = 4;
  do {
    uVar10 = *(uint *)((long)auStack_25020 + lVar15);
    if (uVar10 != 0xffffffff) {
      pcVar13 = "DATA";
      if (lVar15 == 0) {
        pcVar13 = "CTRL";
      }
      logmsg("[%s] CLOSING server socket (cleanup)",pcVar13);
      shutdown(uVar10,2);
      close(uVar10);
    }
    uVar11 = *(uint *)((long)auStack_25020 + lVar15 + 8);
    if (uVar11 != 0xffffffff) {
      pcVar13 = "DATA";
      if (lVar15 == 0) {
        pcVar13 = "CTRL";
      }
      logmsg("[%s] CLOSING client socket (cleanup)",pcVar13);
      shutdown(uVar11,2);
      close(uVar11);
    }
    if ((uVar11 & uVar10) != 0xffffffff) {
      pcVar13 = "DATA";
      if (lVar15 == 0) {
        pcVar13 = "CTRL";
      }
      logmsg("[%s] ABORTING",pcVar13);
    }
    lVar15 = lVar15 + -4;
  } while (lVar15 != -4);
  *pcStack_24fa8 = -1;
  return;
}

Assistant:

static void http_connect(curl_socket_t *infdp,
                         curl_socket_t rootfd,
                         const char *ipaddr,
                         unsigned short ipport)
{
  curl_socket_t serverfd[2] = {CURL_SOCKET_BAD, CURL_SOCKET_BAD};
  curl_socket_t clientfd[2] = {CURL_SOCKET_BAD, CURL_SOCKET_BAD};
  ssize_t toc[2] = {0, 0}; /* number of bytes to client */
  ssize_t tos[2] = {0, 0}; /* number of bytes to server */
  char readclient[2][256];
  char readserver[2][256];
  bool poll_client_rd[2] = { TRUE, TRUE };
  bool poll_server_rd[2] = { TRUE, TRUE };
  bool poll_client_wr[2] = { TRUE, TRUE };
  bool poll_server_wr[2] = { TRUE, TRUE };
  bool primary = FALSE;
  bool secondary = FALSE;
  int max_tunnel_idx; /* CTRL or DATA */
  int loop;
  int i;
  int timeout_count = 0;

  /* primary tunnel client endpoint already connected */
  clientfd[CTRL] = *infdp;

  /* Sleep here to make sure the client reads CONNECT response's
     'end of headers' separate from the server data that follows.
     This is done to prevent triggering libcurl known bug #39. */
  for(loop = 2; (loop > 0) && !got_exit_signal; loop--)
    wait_ms(250);
  if(got_exit_signal)
    goto http_connect_cleanup;

  serverfd[CTRL] = connect_to(ipaddr, ipport);
  if(serverfd[CTRL] == CURL_SOCKET_BAD)
    goto http_connect_cleanup;

  /* Primary tunnel socket endpoints are now connected. Tunnel data back and
     forth over the primary tunnel until client or server breaks the primary
     tunnel, simultaneously allowing establishment, operation and teardown of
     a secondary tunnel that may be used for passive FTP data connection. */

  max_tunnel_idx = CTRL;
  primary = TRUE;

  while(!got_exit_signal) {

    fd_set input;
    fd_set output;
    struct timeval timeout = {1, 0}; /* 1000 ms */
    ssize_t rc;
    curl_socket_t maxfd = (curl_socket_t)-1;

    FD_ZERO(&input);
    FD_ZERO(&output);

    if((clientfd[DATA] == CURL_SOCKET_BAD) &&
       (serverfd[DATA] == CURL_SOCKET_BAD) &&
       poll_client_rd[CTRL] && poll_client_wr[CTRL] &&
       poll_server_rd[CTRL] && poll_server_wr[CTRL]) {
      /* listener socket is monitored to allow client to establish
         secondary tunnel only when this tunnel is not established
         and primary one is fully operational */
      FD_SET(rootfd, &input);
      maxfd = rootfd;
    }

    /* set tunnel sockets to wait for */
    for(i = 0; i <= max_tunnel_idx; i++) {
      /* client side socket monitoring */
      if(clientfd[i] != CURL_SOCKET_BAD) {
        if(poll_client_rd[i]) {
          /* unless told not to do so, monitor readability */
          FD_SET(clientfd[i], &input);
          if(clientfd[i] > maxfd)
            maxfd = clientfd[i];
        }
        if(poll_client_wr[i] && toc[i]) {
          /* unless told not to do so, monitor writability
             if there is data ready to be sent to client */
          FD_SET(clientfd[i], &output);
          if(clientfd[i] > maxfd)
            maxfd = clientfd[i];
        }
      }
      /* server side socket monitoring */
      if(serverfd[i] != CURL_SOCKET_BAD) {
        if(poll_server_rd[i]) {
          /* unless told not to do so, monitor readability */
          FD_SET(serverfd[i], &input);
          if(serverfd[i] > maxfd)
            maxfd = serverfd[i];
        }
        if(poll_server_wr[i] && tos[i]) {
          /* unless told not to do so, monitor writability
             if there is data ready to be sent to server */
          FD_SET(serverfd[i], &output);
          if(serverfd[i] > maxfd)
            maxfd = serverfd[i];
        }
      }
    }
    if(got_exit_signal)
      break;

    do {
      rc = select((int)maxfd + 1, &input, &output, NULL, &timeout);
    } while(rc < 0 && errno == EINTR && !got_exit_signal);

    if(got_exit_signal)
      break;

    if(rc > 0) {
      /* socket action */
      bool tcp_fin_wr = FALSE;
      timeout_count = 0;

      /* ---------------------------------------------------------- */

      /* passive mode FTP may establish a secondary tunnel */
      if((clientfd[DATA] == CURL_SOCKET_BAD) &&
         (serverfd[DATA] == CURL_SOCKET_BAD) && FD_ISSET(rootfd, &input)) {
        /* a new connection on listener socket (most likely from client) */
        curl_socket_t datafd = accept(rootfd, NULL, NULL);
        if(datafd != CURL_SOCKET_BAD) {
          struct httprequest req2;
          int err = 0;
          memset(&req2, 0, sizeof(req2));
          logmsg("====> Client connect DATA");
#ifdef TCP_NODELAY
          if(socket_domain_is_ip()) {
            /* Disable the Nagle algorithm */
            curl_socklen_t flag = 1;
            if(0 != setsockopt(datafd, IPPROTO_TCP, TCP_NODELAY,
                               (void *)&flag, sizeof(flag)))
              logmsg("====> TCP_NODELAY for client DATA connection failed");
          }
#endif
          req2.pipelining = FALSE;
          init_httprequest(&req2);
          while(!req2.done_processing) {
            err = get_request(datafd, &req2);
            if(err < 0) {
              /* this socket must be closed, done or not */
              break;
            }
          }

          /* skip this and close the socket if err < 0 */
          if(err >= 0) {
            err = send_doc(datafd, &req2);
            if(!err && req2.connect_request) {
              /* sleep to prevent triggering libcurl known bug #39. */
              for(loop = 2; (loop > 0) && !got_exit_signal; loop--)
                wait_ms(250);
              if(!got_exit_signal) {
                /* connect to the server */
                serverfd[DATA] = connect_to(ipaddr, req2.connect_port);
                if(serverfd[DATA] != CURL_SOCKET_BAD) {
                  /* secondary tunnel established, now we have two
                     connections */
                  poll_client_rd[DATA] = TRUE;
                  poll_client_wr[DATA] = TRUE;
                  poll_server_rd[DATA] = TRUE;
                  poll_server_wr[DATA] = TRUE;
                  max_tunnel_idx = DATA;
                  secondary = TRUE;
                  toc[DATA] = 0;
                  tos[DATA] = 0;
                  clientfd[DATA] = datafd;
                  datafd = CURL_SOCKET_BAD;
                }
              }
            }
          }
          if(datafd != CURL_SOCKET_BAD) {
            /* secondary tunnel not established */
            shutdown(datafd, SHUT_RDWR);
            sclose(datafd);
          }
        }
        if(got_exit_signal)
          break;
      }

      /* ---------------------------------------------------------- */

      /* react to tunnel endpoint readable/writable notifications */
      for(i = 0; i <= max_tunnel_idx; i++) {
        size_t len;
        if(clientfd[i] != CURL_SOCKET_BAD) {
          len = sizeof(readclient[i]) - tos[i];
          if(len && FD_ISSET(clientfd[i], &input)) {
            /* read from client */
            rc = sread(clientfd[i], &readclient[i][tos[i]], len);
            if(rc <= 0) {
              logmsg("[%s] got %zd, STOP READING client", data_or_ctrl(i), rc);
              shutdown(clientfd[i], SHUT_RD);
              poll_client_rd[i] = FALSE;
            }
            else {
              logmsg("[%s] READ %zd bytes from client", data_or_ctrl(i), rc);
              logmsg("[%s] READ \"%s\"", data_or_ctrl(i),
                     data_to_hex(&readclient[i][tos[i]], rc));
              tos[i] += rc;
            }
          }
        }
        if(serverfd[i] != CURL_SOCKET_BAD) {
          len = sizeof(readserver[i])-toc[i];
          if(len && FD_ISSET(serverfd[i], &input)) {
            /* read from server */
            rc = sread(serverfd[i], &readserver[i][toc[i]], len);
            if(rc <= 0) {
              logmsg("[%s] got %zd, STOP READING server", data_or_ctrl(i), rc);
              shutdown(serverfd[i], SHUT_RD);
              poll_server_rd[i] = FALSE;
            }
            else {
              logmsg("[%s] READ %zd bytes from server", data_or_ctrl(i), rc);
              logmsg("[%s] READ \"%s\"", data_or_ctrl(i),
                     data_to_hex(&readserver[i][toc[i]], rc));
              toc[i] += rc;
            }
          }
        }
        if(clientfd[i] != CURL_SOCKET_BAD) {
          if(toc[i] && FD_ISSET(clientfd[i], &output)) {
            /* write to client */
            rc = swrite(clientfd[i], readserver[i], toc[i]);
            if(rc <= 0) {
              logmsg("[%s] got %zd, STOP WRITING client", data_or_ctrl(i), rc);
              shutdown(clientfd[i], SHUT_WR);
              poll_client_wr[i] = FALSE;
              tcp_fin_wr = TRUE;
            }
            else {
              logmsg("[%s] SENT %zd bytes to client", data_or_ctrl(i), rc);
              logmsg("[%s] SENT \"%s\"", data_or_ctrl(i),
                     data_to_hex(readserver[i], rc));
              if(toc[i] - rc)
                memmove(&readserver[i][0], &readserver[i][rc], toc[i]-rc);
              toc[i] -= rc;
            }
          }
        }
        if(serverfd[i] != CURL_SOCKET_BAD) {
          if(tos[i] && FD_ISSET(serverfd[i], &output)) {
            /* write to server */
            rc = swrite(serverfd[i], readclient[i], tos[i]);
            if(rc <= 0) {
              logmsg("[%s] got %zd, STOP WRITING server", data_or_ctrl(i), rc);
              shutdown(serverfd[i], SHUT_WR);
              poll_server_wr[i] = FALSE;
              tcp_fin_wr = TRUE;
            }
            else {
              logmsg("[%s] SENT %zd bytes to server", data_or_ctrl(i), rc);
              logmsg("[%s] SENT \"%s\"", data_or_ctrl(i),
                     data_to_hex(readclient[i], rc));
              if(tos[i] - rc)
                memmove(&readclient[i][0], &readclient[i][rc], tos[i]-rc);
              tos[i] -= rc;
            }
          }
        }
      }
      if(got_exit_signal)
        break;

      /* ---------------------------------------------------------- */

      /* endpoint read/write disabling, endpoint closing and tunnel teardown */
      for(i = 0; i <= max_tunnel_idx; i++) {
        for(loop = 2; loop > 0; loop--) {
          /* loop twice to satisfy condition interdependencies without
             having to await select timeout or another socket event */
          if(clientfd[i] != CURL_SOCKET_BAD) {
            if(poll_client_rd[i] && !poll_server_wr[i]) {
              logmsg("[%s] DISABLED READING client", data_or_ctrl(i));
              shutdown(clientfd[i], SHUT_RD);
              poll_client_rd[i] = FALSE;
            }
            if(poll_client_wr[i] && !poll_server_rd[i] && !toc[i]) {
              logmsg("[%s] DISABLED WRITING client", data_or_ctrl(i));
              shutdown(clientfd[i], SHUT_WR);
              poll_client_wr[i] = FALSE;
              tcp_fin_wr = TRUE;
            }
          }
          if(serverfd[i] != CURL_SOCKET_BAD) {
            if(poll_server_rd[i] && !poll_client_wr[i]) {
              logmsg("[%s] DISABLED READING server", data_or_ctrl(i));
              shutdown(serverfd[i], SHUT_RD);
              poll_server_rd[i] = FALSE;
            }
            if(poll_server_wr[i] && !poll_client_rd[i] && !tos[i]) {
              logmsg("[%s] DISABLED WRITING server", data_or_ctrl(i));
              shutdown(serverfd[i], SHUT_WR);
              poll_server_wr[i] = FALSE;
              tcp_fin_wr = TRUE;
            }
          }
        }
      }

      if(tcp_fin_wr)
        /* allow kernel to place FIN bit packet on the wire */
        wait_ms(250);

      /* socket clearing */
      for(i = 0; i <= max_tunnel_idx; i++) {
        for(loop = 2; loop > 0; loop--) {
          if(clientfd[i] != CURL_SOCKET_BAD) {
            if(!poll_client_wr[i] && !poll_client_rd[i]) {
              logmsg("[%s] CLOSING client socket", data_or_ctrl(i));
              sclose(clientfd[i]);
              clientfd[i] = CURL_SOCKET_BAD;
              if(serverfd[i] == CURL_SOCKET_BAD) {
                logmsg("[%s] ENDING", data_or_ctrl(i));
                if(i == DATA)
                  secondary = FALSE;
                else
                  primary = FALSE;
              }
            }
          }
          if(serverfd[i] != CURL_SOCKET_BAD) {
            if(!poll_server_wr[i] && !poll_server_rd[i]) {
              logmsg("[%s] CLOSING server socket", data_or_ctrl(i));
              sclose(serverfd[i]);
              serverfd[i] = CURL_SOCKET_BAD;
              if(clientfd[i] == CURL_SOCKET_BAD) {
                logmsg("[%s] ENDING", data_or_ctrl(i));
                if(i == DATA)
                  secondary = FALSE;
                else
                  primary = FALSE;
              }
            }
          }
        }
      }

      /* ---------------------------------------------------------- */

      max_tunnel_idx = secondary ? DATA : CTRL;

      if(!primary)
        /* exit loop upon primary tunnel teardown */
        break;

    } /* (rc > 0) */
    else {
      timeout_count++;
      if(timeout_count > 5) {
        logmsg("CONNECT proxy timeout after %d idle seconds!", timeout_count);
        break;
      }
    }
  }

http_connect_cleanup:

  for(i = DATA; i >= CTRL; i--) {
    if(serverfd[i] != CURL_SOCKET_BAD) {
      logmsg("[%s] CLOSING server socket (cleanup)", data_or_ctrl(i));
      shutdown(serverfd[i], SHUT_RDWR);
      sclose(serverfd[i]);
    }
    if(clientfd[i] != CURL_SOCKET_BAD) {
      logmsg("[%s] CLOSING client socket (cleanup)", data_or_ctrl(i));
      shutdown(clientfd[i], SHUT_RDWR);
      sclose(clientfd[i]);
    }
    if((serverfd[i] != CURL_SOCKET_BAD) ||
       (clientfd[i] != CURL_SOCKET_BAD)) {
      logmsg("[%s] ABORTING", data_or_ctrl(i));
    }
  }

  *infdp = CURL_SOCKET_BAD;
}